

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglGLES2SharingTests.cpp
# Opt level: O2

int __thiscall deqp::egl::SharingTests::init(SharingTests *this,EVP_PKEY_CTX *ctx)

{
  int extraout_EAX;
  TestCaseGroup *this_00;
  TestCaseGroup *pTVar1;
  GLES2SharingTest *pGVar2;
  GLES2BufferSharingTest *pGVar3;
  GLES2TextureSharingTest *pGVar4;
  GLES2ProgramSharingTest *pGVar5;
  GLES2ShaderSharingTest *pGVar6;
  TestNode *node;
  TestSpec local_34;
  
  this_00 = (TestCaseGroup *)operator_new(0x78);
  TestCaseGroup::TestCaseGroup
            (this_00,(this->super_TestCaseGroup).m_eglTestCtx,"gles2","OpenGL ES 2 sharing test");
  pTVar1 = (TestCaseGroup *)operator_new(0x78);
  TestCaseGroup::TestCaseGroup
            (pTVar1,(this->super_TestCaseGroup).m_eglTestCtx,"context",
             "Context creation and destruction tests");
  local_34.destroyContextBFirst = false;
  local_34.useResource = false;
  local_34.destroyOnContexB = false;
  local_34.initializeData = true;
  local_34.renderOnContexA = true;
  local_34.renderOnContexB = true;
  local_34.verifyOnContexA = true;
  local_34.verifyOnContexB = true;
  pGVar2 = (GLES2SharingTest *)operator_new(0x1ac8);
  GLES2SharingTest::GLES2SharingTest
            (pGVar2,(this->super_TestCaseGroup).m_eglTestCtx,"create_destroy",
             "Simple context creation and destruction",&local_34);
  tcu::TestNode::addChild((TestNode *)pTVar1,(TestNode *)pGVar2);
  local_34.destroyContextBFirst = true;
  local_34.useResource = false;
  local_34.destroyOnContexB = false;
  local_34.initializeData = false;
  local_34.renderOnContexA = false;
  local_34.renderOnContexB = false;
  local_34.verifyOnContexA = false;
  local_34.verifyOnContexB = false;
  pGVar2 = (GLES2SharingTest *)operator_new(0x1ac8);
  GLES2SharingTest::GLES2SharingTest
            (pGVar2,(this->super_TestCaseGroup).m_eglTestCtx,"create_destroy_mixed",
             "Simple context creation and destruction test with different destruction order",
             &local_34);
  tcu::TestNode::addChild((TestNode *)pTVar1,(TestNode *)pGVar2);
  tcu::TestNode::addChild((TestNode *)this_00,(TestNode *)pTVar1);
  pTVar1 = (TestCaseGroup *)operator_new(0x78);
  TestCaseGroup::TestCaseGroup
            (pTVar1,(this->super_TestCaseGroup).m_eglTestCtx,"buffer",
             "Buffer creation, destruction and rendering test");
  local_34.destroyContextBFirst = false;
  local_34.useResource = true;
  local_34.destroyOnContexB = false;
  local_34.initializeData = true;
  local_34.renderOnContexA = false;
  local_34.renderOnContexB = false;
  local_34.verifyOnContexA = false;
  local_34.verifyOnContexB = false;
  pGVar3 = (GLES2BufferSharingTest *)operator_new(0x1ae8);
  GLES2BufferSharingTest::GLES2BufferSharingTest
            (pGVar3,(this->super_TestCaseGroup).m_eglTestCtx,"create_delete",
             "Create and delete on shared context",&local_34);
  tcu::TestNode::addChild((TestNode *)pTVar1,(TestNode *)pGVar3);
  local_34.destroyContextBFirst = false;
  local_34.useResource = true;
  local_34.destroyOnContexB = true;
  local_34.initializeData = true;
  local_34.renderOnContexA = false;
  local_34.renderOnContexB = false;
  local_34.verifyOnContexA = false;
  local_34.verifyOnContexB = false;
  pGVar3 = (GLES2BufferSharingTest *)operator_new(0x1ae8);
  GLES2BufferSharingTest::GLES2BufferSharingTest
            (pGVar3,(this->super_TestCaseGroup).m_eglTestCtx,"create_delete_mixed",
             "Create and delet on different contexts",&local_34);
  tcu::TestNode::addChild((TestNode *)pTVar1,(TestNode *)pGVar3);
  local_34.destroyContextBFirst = false;
  local_34.useResource = true;
  local_34.destroyOnContexB = false;
  local_34.initializeData = true;
  local_34.renderOnContexA = true;
  local_34.renderOnContexB = true;
  local_34.verifyOnContexA = true;
  local_34.verifyOnContexB = true;
  pGVar3 = (GLES2BufferSharingTest *)operator_new(0x1ae8);
  GLES2BufferSharingTest::GLES2BufferSharingTest
            (pGVar3,(this->super_TestCaseGroup).m_eglTestCtx,"render",
             "Create, rendering on two different contexts and delete",&local_34);
  tcu::TestNode::addChild((TestNode *)pTVar1,(TestNode *)pGVar3);
  tcu::TestNode::addChild((TestNode *)this_00,(TestNode *)pTVar1);
  pTVar1 = (TestCaseGroup *)operator_new(0x78);
  TestCaseGroup::TestCaseGroup
            (pTVar1,(this->super_TestCaseGroup).m_eglTestCtx,"texture",
             "Texture creation, destruction and rendering tests");
  local_34.destroyContextBFirst = false;
  local_34.useResource = true;
  local_34.destroyOnContexB = false;
  local_34.initializeData = true;
  local_34.renderOnContexA = false;
  local_34.renderOnContexB = false;
  local_34.verifyOnContexA = false;
  local_34.verifyOnContexB = false;
  pGVar4 = (GLES2TextureSharingTest *)operator_new(0x1b20);
  GLES2TextureSharingTest::GLES2TextureSharingTest
            (pGVar4,(this->super_TestCaseGroup).m_eglTestCtx,"create_delete",
             "Create and delete on shared context",&local_34);
  tcu::TestNode::addChild((TestNode *)pTVar1,(TestNode *)pGVar4);
  local_34.destroyContextBFirst = false;
  local_34.useResource = true;
  local_34.destroyOnContexB = true;
  local_34.initializeData = true;
  local_34.renderOnContexA = false;
  local_34.renderOnContexB = false;
  local_34.verifyOnContexA = false;
  local_34.verifyOnContexB = false;
  pGVar4 = (GLES2TextureSharingTest *)operator_new(0x1b20);
  GLES2TextureSharingTest::GLES2TextureSharingTest
            (pGVar4,(this->super_TestCaseGroup).m_eglTestCtx,"create_delete_mixed",
             "Create and delete on different contexts",&local_34);
  tcu::TestNode::addChild((TestNode *)pTVar1,(TestNode *)pGVar4);
  local_34.destroyContextBFirst = false;
  local_34.useResource = true;
  local_34.destroyOnContexB = false;
  local_34.initializeData = true;
  local_34.renderOnContexA = true;
  local_34.renderOnContexB = true;
  local_34.verifyOnContexA = true;
  local_34.verifyOnContexB = true;
  pGVar4 = (GLES2TextureSharingTest *)operator_new(0x1b20);
  GLES2TextureSharingTest::GLES2TextureSharingTest
            (pGVar4,(this->super_TestCaseGroup).m_eglTestCtx,"render",
             "Create, render in two contexts and delete",&local_34);
  tcu::TestNode::addChild((TestNode *)pTVar1,(TestNode *)pGVar4);
  tcu::TestNode::addChild((TestNode *)this_00,(TestNode *)pTVar1);
  pTVar1 = (TestCaseGroup *)operator_new(0x78);
  TestCaseGroup::TestCaseGroup
            (pTVar1,(this->super_TestCaseGroup).m_eglTestCtx,"program",
             "Program creation, destruction and rendering test");
  local_34.destroyContextBFirst = false;
  local_34.useResource = true;
  local_34.destroyOnContexB = false;
  local_34.initializeData = true;
  local_34.renderOnContexA = false;
  local_34.renderOnContexB = false;
  local_34.verifyOnContexA = false;
  local_34.verifyOnContexB = false;
  pGVar5 = (GLES2ProgramSharingTest *)operator_new(0x1ad0);
  GLES2ProgramSharingTest::GLES2ProgramSharingTest
            (pGVar5,(this->super_TestCaseGroup).m_eglTestCtx,"create_delete",
             "Create and delete on shared context",&local_34);
  tcu::TestNode::addChild((TestNode *)pTVar1,(TestNode *)pGVar5);
  local_34.destroyContextBFirst = false;
  local_34.useResource = true;
  local_34.destroyOnContexB = true;
  local_34.initializeData = true;
  local_34.renderOnContexA = false;
  local_34.renderOnContexB = false;
  local_34.verifyOnContexA = false;
  local_34.verifyOnContexB = false;
  pGVar5 = (GLES2ProgramSharingTest *)operator_new(0x1ad0);
  GLES2ProgramSharingTest::GLES2ProgramSharingTest
            (pGVar5,(this->super_TestCaseGroup).m_eglTestCtx,"create_delete_mixed",
             "Create and delete on different contexts",&local_34);
  tcu::TestNode::addChild((TestNode *)pTVar1,(TestNode *)pGVar5);
  local_34.destroyContextBFirst = false;
  local_34.useResource = true;
  local_34.destroyOnContexB = false;
  local_34.initializeData = true;
  local_34.renderOnContexA = true;
  local_34.renderOnContexB = true;
  local_34.verifyOnContexA = true;
  local_34.verifyOnContexB = true;
  pGVar5 = (GLES2ProgramSharingTest *)operator_new(0x1ad0);
  GLES2ProgramSharingTest::GLES2ProgramSharingTest
            (pGVar5,(this->super_TestCaseGroup).m_eglTestCtx,"render",
             "Create, render in two contexts and delete",&local_34);
  tcu::TestNode::addChild((TestNode *)pTVar1,(TestNode *)pGVar5);
  tcu::TestNode::addChild((TestNode *)this_00,(TestNode *)pTVar1);
  pTVar1 = (TestCaseGroup *)operator_new(0x78);
  TestCaseGroup::TestCaseGroup
            (pTVar1,(this->super_TestCaseGroup).m_eglTestCtx,"shader",
             "Shader creation, destruction and rendering test");
  local_34.destroyContextBFirst = false;
  local_34.useResource = true;
  local_34.destroyOnContexB = false;
  local_34.initializeData = true;
  local_34.renderOnContexA = false;
  local_34.renderOnContexB = false;
  local_34.verifyOnContexA = false;
  local_34.verifyOnContexB = false;
  pGVar6 = (GLES2ShaderSharingTest *)operator_new(0x1ad0);
  GLES2ShaderSharingTest::GLES2ShaderSharingTest
            (pGVar6,(this->super_TestCaseGroup).m_eglTestCtx,"create_delete_vert",
             "Create and delete on shared context",0x8b31,&local_34);
  tcu::TestNode::addChild((TestNode *)pTVar1,(TestNode *)pGVar6);
  local_34.destroyContextBFirst = false;
  local_34.useResource = true;
  local_34.destroyOnContexB = true;
  local_34.initializeData = true;
  local_34.renderOnContexA = false;
  local_34.renderOnContexB = false;
  local_34.verifyOnContexA = false;
  local_34.verifyOnContexB = false;
  pGVar6 = (GLES2ShaderSharingTest *)operator_new(0x1ad0);
  GLES2ShaderSharingTest::GLES2ShaderSharingTest
            (pGVar6,(this->super_TestCaseGroup).m_eglTestCtx,"create_delete_mixed_vert",
             "Create and delete on different contexts",0x8b31,&local_34);
  tcu::TestNode::addChild((TestNode *)pTVar1,(TestNode *)pGVar6);
  local_34.destroyContextBFirst = false;
  local_34.useResource = true;
  local_34.destroyOnContexB = false;
  local_34.initializeData = true;
  local_34.renderOnContexA = true;
  local_34.renderOnContexB = true;
  local_34.verifyOnContexA = true;
  local_34.verifyOnContexB = true;
  pGVar6 = (GLES2ShaderSharingTest *)operator_new(0x1ad0);
  GLES2ShaderSharingTest::GLES2ShaderSharingTest
            (pGVar6,(this->super_TestCaseGroup).m_eglTestCtx,"render_vert",
             "Create, render on two contexts and delete",0x8b31,&local_34);
  tcu::TestNode::addChild((TestNode *)pTVar1,(TestNode *)pGVar6);
  local_34.destroyContextBFirst = false;
  local_34.useResource = true;
  local_34.destroyOnContexB = false;
  local_34.initializeData = true;
  local_34.renderOnContexA = false;
  local_34.renderOnContexB = false;
  local_34.verifyOnContexA = false;
  local_34.verifyOnContexB = false;
  pGVar6 = (GLES2ShaderSharingTest *)operator_new(0x1ad0);
  GLES2ShaderSharingTest::GLES2ShaderSharingTest
            (pGVar6,(this->super_TestCaseGroup).m_eglTestCtx,"create_delete_frag",
             "Create and delete on shared context",0x8b30,&local_34);
  tcu::TestNode::addChild((TestNode *)pTVar1,(TestNode *)pGVar6);
  local_34.destroyContextBFirst = false;
  local_34.useResource = true;
  local_34.destroyOnContexB = true;
  local_34.initializeData = true;
  local_34.renderOnContexA = false;
  local_34.renderOnContexB = false;
  local_34.verifyOnContexA = false;
  local_34.verifyOnContexB = false;
  pGVar6 = (GLES2ShaderSharingTest *)operator_new(0x1ad0);
  GLES2ShaderSharingTest::GLES2ShaderSharingTest
            (pGVar6,(this->super_TestCaseGroup).m_eglTestCtx,"create_delete_mixed_frag",
             "Create and delete on different contexts",0x8b30,&local_34);
  tcu::TestNode::addChild((TestNode *)pTVar1,(TestNode *)pGVar6);
  local_34.destroyContextBFirst = false;
  local_34.useResource = true;
  local_34.destroyOnContexB = false;
  local_34.initializeData = true;
  local_34.renderOnContexA = true;
  local_34.renderOnContexB = true;
  local_34.verifyOnContexA = true;
  local_34.verifyOnContexB = true;
  pGVar6 = (GLES2ShaderSharingTest *)operator_new(0x1ad0);
  GLES2ShaderSharingTest::GLES2ShaderSharingTest
            (pGVar6,(this->super_TestCaseGroup).m_eglTestCtx,"render_frag",
             "Create, render on two contexts and delete",0x8b30,&local_34);
  tcu::TestNode::addChild((TestNode *)pTVar1,(TestNode *)pGVar6);
  tcu::TestNode::addChild((TestNode *)this_00,(TestNode *)pTVar1);
  node = (TestNode *)operator_new(0x78);
  GLES2SharingThreadedTests::GLES2SharingThreadedTests
            ((GLES2SharingThreadedTests *)node,(this->super_TestCaseGroup).m_eglTestCtx);
  tcu::TestNode::addChild((TestNode *)this_00,node);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_00);
  return extraout_EAX;
}

Assistant:

void SharingTests::init (void)
{
	TestCaseGroup* gles2 = new TestCaseGroup(m_eglTestCtx, "gles2", "OpenGL ES 2 sharing test");

	TestCaseGroup* context = new TestCaseGroup(m_eglTestCtx, "context", "Context creation and destruction tests");

	{
		GLES2SharingTest::TestSpec spec;
		spec.destroyContextBFirst	= false;
		spec.useResource			= false;
		spec.destroyOnContexB		= false;
		spec.initializeData			= true;
		spec.renderOnContexA		= true;
		spec.renderOnContexB		= true;
		spec.verifyOnContexA		= true;
		spec.verifyOnContexB		= true;

		context->addChild(new GLES2SharingTest(m_eglTestCtx, "create_destroy", "Simple context creation and destruction", spec));
	}
	{
		GLES2SharingTest::TestSpec spec;
		spec.destroyContextBFirst	= true;
		spec.useResource			= false;
		spec.destroyOnContexB		= false;
		spec.initializeData			= false;
		spec.renderOnContexA		= false;
		spec.renderOnContexB		= false;
		spec.verifyOnContexA		= false;
		spec.verifyOnContexB		= false;

		context->addChild(new GLES2SharingTest(m_eglTestCtx, "create_destroy_mixed", "Simple context creation and destruction test with different destruction order", spec));
	}

	gles2->addChild(context);

	TestCaseGroup* buffer = new TestCaseGroup(m_eglTestCtx, "buffer", "Buffer creation, destruction and rendering test");

	{
		GLES2SharingTest::TestSpec spec;
		spec.destroyContextBFirst	= false;
		spec.useResource			= true;
		spec.destroyOnContexB		= false;
		spec.initializeData			= true;
		spec.renderOnContexA		= false;
		spec.renderOnContexB		= false;
		spec.verifyOnContexA		= false;
		spec.verifyOnContexB		= false;

		buffer->addChild(new GLES2BufferSharingTest(m_eglTestCtx, "create_delete", "Create and delete on shared context", spec));
	}
	{
		GLES2SharingTest::TestSpec spec;
		spec.destroyContextBFirst	= false;
		spec.useResource			= true;
		spec.destroyOnContexB		= true;
		spec.initializeData			= true;
		spec.renderOnContexA		= false;
		spec.renderOnContexB		= false;
		spec.verifyOnContexA		= false;
		spec.verifyOnContexB		= false;

		buffer->addChild(new GLES2BufferSharingTest(m_eglTestCtx, "create_delete_mixed", "Create and delet on different contexts", spec));
	}
	{
		GLES2SharingTest::TestSpec spec;
		spec.destroyContextBFirst	= false;
		spec.useResource			= true;
		spec.destroyOnContexB		= false;
		spec.initializeData			= true;
		spec.renderOnContexA		= true;
		spec.renderOnContexB		= true;
		spec.verifyOnContexA		= true;
		spec.verifyOnContexB		= true;

		buffer->addChild(new GLES2BufferSharingTest(m_eglTestCtx, "render", "Create, rendering on two different contexts and delete", spec));
	}

	gles2->addChild(buffer);

	TestCaseGroup* texture = new TestCaseGroup(m_eglTestCtx, "texture", "Texture creation, destruction and rendering tests");

	{
		GLES2SharingTest::TestSpec spec;
		spec.destroyContextBFirst	= false;
		spec.useResource			= true;
		spec.destroyOnContexB		= false;
		spec.initializeData			= true;
		spec.renderOnContexA		= false;
		spec.renderOnContexB		= false;
		spec.verifyOnContexA		= false;
		spec.verifyOnContexB		= false;

		texture->addChild(new GLES2TextureSharingTest(m_eglTestCtx, "create_delete", "Create and delete on shared context", spec));
	}
	{
		GLES2SharingTest::TestSpec spec;
		spec.destroyContextBFirst	= false;
		spec.useResource			= true;
		spec.destroyOnContexB		= true;
		spec.initializeData			= true;
		spec.renderOnContexA		= false;
		spec.renderOnContexB		= false;
		spec.verifyOnContexA		= false;
		spec.verifyOnContexB		= false;

		texture->addChild(new GLES2TextureSharingTest(m_eglTestCtx, "create_delete_mixed", "Create and delete on different contexts", spec));
	}
	{
		GLES2SharingTest::TestSpec spec;
		spec.destroyContextBFirst	= false;
		spec.useResource			= true;
		spec.destroyOnContexB		= false;
		spec.initializeData			= true;
		spec.renderOnContexA		= true;
		spec.renderOnContexB		= true;
		spec.verifyOnContexA		= true;
		spec.verifyOnContexB		= true;

		texture->addChild(new GLES2TextureSharingTest(m_eglTestCtx, "render", "Create, render in two contexts and delete", spec));
	}

	gles2->addChild(texture);

	TestCaseGroup* program = new TestCaseGroup(m_eglTestCtx, "program", "Program creation, destruction and rendering test");

	{
		GLES2SharingTest::TestSpec spec;
		spec.destroyContextBFirst	= false;
		spec.useResource			= true;
		spec.destroyOnContexB		= false;
		spec.initializeData			= true;
		spec.renderOnContexA		= false;
		spec.renderOnContexB		= false;
		spec.verifyOnContexA		= false;
		spec.verifyOnContexB		= false;

		program->addChild(new GLES2ProgramSharingTest(m_eglTestCtx, "create_delete", "Create and delete on shared context", spec));
	}
	{
		GLES2SharingTest::TestSpec spec;
		spec.destroyContextBFirst	= false;
		spec.useResource			= true;
		spec.destroyOnContexB		= true;
		spec.initializeData			= true;
		spec.renderOnContexA		= false;
		spec.renderOnContexB		= false;
		spec.verifyOnContexA		= false;
		spec.verifyOnContexB		= false;

		program->addChild(new GLES2ProgramSharingTest(m_eglTestCtx, "create_delete_mixed", "Create and delete on different contexts", spec));
	}
	{
		GLES2SharingTest::TestSpec spec;
		spec.destroyContextBFirst	= false;
		spec.useResource			= true;
		spec.destroyOnContexB		= false;
		spec.initializeData			= true;
		spec.renderOnContexA		= true;
		spec.renderOnContexB		= true;
		spec.verifyOnContexA		= true;
		spec.verifyOnContexB		= true;

		program->addChild(new GLES2ProgramSharingTest(m_eglTestCtx, "render", "Create, render in two contexts and delete", spec));
	}

	gles2->addChild(program);

	TestCaseGroup* shader = new TestCaseGroup(m_eglTestCtx, "shader", "Shader creation, destruction and rendering test");

	{
		GLES2SharingTest::TestSpec spec;
		spec.destroyContextBFirst	= false;
		spec.useResource			= true;
		spec.destroyOnContexB		= false;
		spec.initializeData			= true;
		spec.renderOnContexA		= false;
		spec.renderOnContexB		= false;
		spec.verifyOnContexA		= false;
		spec.verifyOnContexB		= false;

		shader->addChild(new GLES2ShaderSharingTest(m_eglTestCtx, "create_delete_vert", "Create and delete on shared context", GL_VERTEX_SHADER, spec));
	}
	{
		GLES2SharingTest::TestSpec spec;
		spec.destroyContextBFirst	= false;
		spec.useResource			= true;
		spec.destroyOnContexB		= true;
		spec.initializeData			= true;
		spec.renderOnContexA		= false;
		spec.renderOnContexB		= false;
		spec.verifyOnContexA		= false;
		spec.verifyOnContexB		= false;

		shader->addChild(new GLES2ShaderSharingTest(m_eglTestCtx, "create_delete_mixed_vert", "Create and delete on different contexts", GL_VERTEX_SHADER, spec));
	}
	{
		GLES2SharingTest::TestSpec spec;
		spec.destroyContextBFirst	= false;
		spec.useResource			= true;
		spec.destroyOnContexB		= false;
		spec.initializeData			= true;
		spec.renderOnContexA		= true;
		spec.renderOnContexB		= true;
		spec.verifyOnContexA		= true;
		spec.verifyOnContexB		= true;

		shader->addChild(new GLES2ShaderSharingTest(m_eglTestCtx, "render_vert", "Create, render on two contexts and delete", GL_VERTEX_SHADER, spec));
	}
	{
		GLES2SharingTest::TestSpec spec;
		spec.destroyContextBFirst	= false;
		spec.useResource			= true;
		spec.destroyOnContexB		= false;
		spec.initializeData			= true;
		spec.renderOnContexA		= false;
		spec.renderOnContexB		= false;
		spec.verifyOnContexA		= false;
		spec.verifyOnContexB		= false;

		shader->addChild(new GLES2ShaderSharingTest(m_eglTestCtx, "create_delete_frag", "Create and delete on shared context", GL_FRAGMENT_SHADER, spec));
	}
	{
		GLES2SharingTest::TestSpec spec;
		spec.destroyContextBFirst	= false;
		spec.useResource			= true;
		spec.destroyOnContexB		= true;
		spec.initializeData			= true;
		spec.renderOnContexA		= false;
		spec.renderOnContexB		= false;
		spec.verifyOnContexA		= false;
		spec.verifyOnContexB		= false;

		shader->addChild(new GLES2ShaderSharingTest(m_eglTestCtx, "create_delete_mixed_frag", "Create and delete on different contexts", GL_FRAGMENT_SHADER, spec));
	}
	{
		GLES2SharingTest::TestSpec spec;
		spec.destroyContextBFirst	= false;
		spec.useResource			= true;
		spec.destroyOnContexB		= false;
		spec.initializeData			= true;
		spec.renderOnContexA		= true;
		spec.renderOnContexB		= true;
		spec.verifyOnContexA		= true;
		spec.verifyOnContexB		= true;

		shader->addChild(new GLES2ShaderSharingTest(m_eglTestCtx, "render_frag", "Create, render on two contexts and delete", GL_FRAGMENT_SHADER, spec));
	}


	gles2->addChild(shader);


	gles2->addChild(new GLES2SharingThreadedTests(m_eglTestCtx));

	addChild(gles2);
}